

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O3

void aom_minmax_8x8_c(uint8_t *s,int p,uint8_t *d,int dp,int *min,int *max)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  *min = 0xff;
  *max = 0;
  iVar4 = 0;
  do {
    lVar5 = 0;
    do {
      bVar1 = (byte)((uint)s[lVar5] - (uint)d[lVar5]);
      bVar2 = -bVar1;
      if (0 < (int)((uint)s[lVar5] - (uint)d[lVar5])) {
        bVar2 = bVar1;
      }
      uVar3 = *min;
      if ((int)(uint)bVar2 < *min) {
        uVar3 = (uint)bVar2;
      }
      *min = uVar3;
      uVar3 = *max;
      if (*max < (int)(uint)bVar2) {
        uVar3 = (uint)bVar2;
      }
      *max = uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    iVar4 = iVar4 + 1;
    s = s + p;
    d = d + dp;
  } while (iVar4 != 8);
  return;
}

Assistant:

void aom_minmax_8x8_c(const uint8_t *s, int p, const uint8_t *d, int dp,
                      int *min, int *max) {
  int i, j;
  *min = 255;
  *max = 0;
  for (i = 0; i < 8; ++i, s += p, d += dp) {
    for (j = 0; j < 8; ++j) {
      int diff = abs(s[j] - d[j]);
      *min = diff < *min ? diff : *min;
      *max = diff > *max ? diff : *max;
    }
  }
}